

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

void * stbi__bmp_parse_header(stbi__context *s,stbi__bmp_data *info)

{
  stbi_uc sVar1;
  stbi__uint32 sVar2;
  stbi__uint32 sVar3;
  int iVar4;
  int local_2c;
  int i;
  int compress;
  int hsz;
  stbi__bmp_data *info_local;
  stbi__context *s_local;
  
  sVar1 = stbi__get8(s);
  if ((sVar1 == 'B') && (sVar1 = stbi__get8(s), sVar1 == 'M')) {
    stbi__get32le(s);
    stbi__get16le(s);
    stbi__get16le(s);
    sVar2 = stbi__get32le(s);
    info->offset = sVar2;
    sVar2 = stbi__get32le(s);
    info->hsz = sVar2;
    info->ma = 0;
    info->mb = 0;
    info->mg = 0;
    info->mr = 0;
    if ((((sVar2 == 0xc) || (sVar2 == 0x28)) || (sVar2 == 0x38)) ||
       ((sVar2 == 0x6c || (sVar2 == 0x7c)))) {
      if (sVar2 == 0xc) {
        sVar3 = stbi__get16le(s);
        s->img_x = sVar3;
        sVar3 = stbi__get16le(s);
        s->img_y = sVar3;
      }
      else {
        sVar3 = stbi__get32le(s);
        s->img_x = sVar3;
        sVar3 = stbi__get32le(s);
        s->img_y = sVar3;
      }
      iVar4 = stbi__get16le(s);
      if (iVar4 == 1) {
        iVar4 = stbi__get16le(s);
        info->bpp = iVar4;
        if (info->bpp == 1) {
          stbi__err("BMP type not supported: 1-bit");
          s_local = (stbi__context *)0x0;
        }
        else {
          if (sVar2 != 0xc) {
            sVar3 = stbi__get32le(s);
            if ((sVar3 == 1) || (sVar3 == 2)) {
              stbi__err("BMP type not supported: RLE");
              return (void *)0x0;
            }
            stbi__get32le(s);
            stbi__get32le(s);
            stbi__get32le(s);
            stbi__get32le(s);
            stbi__get32le(s);
            if ((sVar2 == 0x28) || (sVar2 == 0x38)) {
              if (sVar2 == 0x38) {
                stbi__get32le(s);
                stbi__get32le(s);
                stbi__get32le(s);
                stbi__get32le(s);
              }
              if ((info->bpp == 0x10) || (info->bpp == 0x20)) {
                if (sVar3 == 0) {
                  if (info->bpp == 0x20) {
                    info->mr = 0xff0000;
                    info->mg = 0xff00;
                    info->mb = 0xff;
                    info->ma = 0xff000000;
                    info->all_a = 0;
                  }
                  else {
                    info->mr = 0x7c00;
                    info->mg = 0x3e0;
                    info->mb = 0x1f;
                  }
                }
                else {
                  if (sVar3 != 3) {
                    stbi__err("bad BMP");
                    return (void *)0x0;
                  }
                  sVar2 = stbi__get32le(s);
                  info->mr = sVar2;
                  sVar2 = stbi__get32le(s);
                  info->mg = sVar2;
                  sVar2 = stbi__get32le(s);
                  info->mb = sVar2;
                  if ((info->mr == info->mg) && (info->mg == info->mb)) {
                    stbi__err("bad BMP");
                    return (void *)0x0;
                  }
                }
              }
            }
            else {
              if ((sVar2 != 0x6c) && (sVar2 != 0x7c)) {
                stbi__err("bad BMP");
                return (void *)0x0;
              }
              sVar3 = stbi__get32le(s);
              info->mr = sVar3;
              sVar3 = stbi__get32le(s);
              info->mg = sVar3;
              sVar3 = stbi__get32le(s);
              info->mb = sVar3;
              sVar3 = stbi__get32le(s);
              info->ma = sVar3;
              stbi__get32le(s);
              for (local_2c = 0; local_2c < 0xc; local_2c = local_2c + 1) {
                stbi__get32le(s);
              }
              if (sVar2 == 0x7c) {
                stbi__get32le(s);
                stbi__get32le(s);
                stbi__get32le(s);
                stbi__get32le(s);
              }
            }
          }
          s_local = (stbi__context *)0x1;
        }
      }
      else {
        stbi__err("bad BMP");
        s_local = (stbi__context *)0x0;
      }
    }
    else {
      stbi__err("BMP type not supported: unknown");
      s_local = (stbi__context *)0x0;
    }
  }
  else {
    stbi__err("Corrupt BMP");
    s_local = (stbi__context *)0x0;
  }
  return s_local;
}

Assistant:

static void *stbi__bmp_parse_header(stbi__context *s, stbi__bmp_data *info)
{
   int hsz;
   if (stbi__get8(s) != 'B' || stbi__get8(s) != 'M') return stbi__errpuc("not BMP", "Corrupt BMP");
   stbi__get32le(s); // discard filesize
   stbi__get16le(s); // discard reserved
   stbi__get16le(s); // discard reserved
   info->offset = stbi__get32le(s);
   info->hsz = hsz = stbi__get32le(s);
   info->mr = info->mg = info->mb = info->ma = 0;

   if (hsz != 12 && hsz != 40 && hsz != 56 && hsz != 108 && hsz != 124) return stbi__errpuc("unknown BMP", "BMP type not supported: unknown");
   if (hsz == 12) {
      s->img_x = stbi__get16le(s);
      s->img_y = stbi__get16le(s);
   } else {
      s->img_x = stbi__get32le(s);
      s->img_y = stbi__get32le(s);
   }
   if (stbi__get16le(s) != 1) return stbi__errpuc("bad BMP", "bad BMP");
   info->bpp = stbi__get16le(s);
   if (info->bpp == 1) return stbi__errpuc("monochrome", "BMP type not supported: 1-bit");
   if (hsz != 12) {
      int compress = stbi__get32le(s);
      if (compress == 1 || compress == 2) return stbi__errpuc("BMP RLE", "BMP type not supported: RLE");
      stbi__get32le(s); // discard sizeof
      stbi__get32le(s); // discard hres
      stbi__get32le(s); // discard vres
      stbi__get32le(s); // discard colorsused
      stbi__get32le(s); // discard max important
      if (hsz == 40 || hsz == 56) {
         if (hsz == 56) {
            stbi__get32le(s);
            stbi__get32le(s);
            stbi__get32le(s);
            stbi__get32le(s);
         }
         if (info->bpp == 16 || info->bpp == 32) {
            if (compress == 0) {
               if (info->bpp == 32) {
                  info->mr = 0xffu << 16;
                  info->mg = 0xffu <<  8;
                  info->mb = 0xffu <<  0;
                  info->ma = 0xffu << 24;
                  info->all_a = 0; // if all_a is 0 at end, then we loaded alpha channel but it was all 0
               } else {
                  info->mr = 31u << 10;
                  info->mg = 31u <<  5;
                  info->mb = 31u <<  0;
               }
            } else if (compress == 3) {
               info->mr = stbi__get32le(s);
               info->mg = stbi__get32le(s);
               info->mb = stbi__get32le(s);
               // not documented, but generated by photoshop and handled by mspaint
               if (info->mr == info->mg && info->mg == info->mb) {
                  // ?!?!?
                  return stbi__errpuc("bad BMP", "bad BMP");
               }
            } else
               return stbi__errpuc("bad BMP", "bad BMP");
         }
      } else {
         int i;
         if (hsz != 108 && hsz != 124)
            return stbi__errpuc("bad BMP", "bad BMP");
         info->mr = stbi__get32le(s);
         info->mg = stbi__get32le(s);
         info->mb = stbi__get32le(s);
         info->ma = stbi__get32le(s);
         stbi__get32le(s); // discard color space
         for (i=0; i < 12; ++i)
            stbi__get32le(s); // discard color space parameters
         if (hsz == 124) {
            stbi__get32le(s); // discard rendering intent
            stbi__get32le(s); // discard offset of profile data
            stbi__get32le(s); // discard size of profile data
            stbi__get32le(s); // discard reserved
         }
      }
   }
   return (void *) 1;
}